

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-read-stop.c
# Opt level: O2

int run_test_tcp_read_stop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_b_3;
  sockaddr_in addr;
  uv_connect_t connect_req;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  connect_req.data = (void *)(long)iVar1;
  if (connect_req.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    connect_req.data = (void *)(long)iVar1;
    if (connect_req.data == (void *)0x0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_tcp_init(puVar2,&tcp_handle);
      connect_req.data = (void *)(long)iVar1;
      if (connect_req.data == (void *)0x0) {
        iVar1 = uv_tcp_connect(&connect_req,&tcp_handle,(sockaddr *)&addr,connect_cb);
        eval_b = (int64_t)iVar1;
        eval_b_3 = 0;
        if ((void *)eval_b == (void *)0x0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
          eval_b = (int64_t)iVar1;
          eval_b_3 = 0;
          if ((void *)eval_b == (void *)0x0) {
            puVar2 = uv_default_loop();
            uv_walk(puVar2,close_walk_cb,(void *)0x0);
            uv_run(puVar2,UV_RUN_DEFAULT);
            eval_b = 0;
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_close(puVar2);
            eval_b_3 = (int64_t)iVar1;
            if (eval_b_3 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(uv_default_loop())";
            pcVar3 = "0";
            uVar5 = 0x49;
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
            uVar5 = 0x48;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = 
          "uv_tcp_connect(&connect_req, &tcp_handle, (const struct sockaddr*) &addr, connect_cb)";
          uVar5 = 0x47;
        }
        goto LAB_00189f37;
      }
      pcVar3 = "uv_tcp_init(uv_default_loop(), &tcp_handle)";
      uVar5 = 0x43;
    }
    else {
      pcVar3 = "uv_timer_init(uv_default_loop(), &timer_handle)";
      uVar5 = 0x42;
    }
  }
  else {
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar5 = 0x41;
  }
  pcVar4 = "0";
  eval_b_3 = 0;
  eval_b = (int64_t)connect_req.data;
LAB_00189f37:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_b,"==",eval_b_3);
  abort();
}

Assistant:

TEST_IMPL(tcp_read_stop) {
  uv_connect_t connect_req;
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp_handle));
  ASSERT_OK(uv_tcp_connect(&connect_req,
                           &tcp_handle,
                           (const struct sockaddr*) &addr,
                           connect_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());

  return 0;
}